

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::PushDot(ParseState *this)

{
  bool bVar1;
  ParseFlags PVar2;
  ParseFlags b;
  Regexp *re_00;
  CharClassBuilder *this_00;
  ParseState *in_RDI;
  Regexp *re;
  Rune in_stack_000000c0;
  Rune in_stack_000000c4;
  CharClassBuilder *in_stack_000000c8;
  ParseFlags in_stack_ffffffffffffffa8;
  RegexpOp in_stack_ffffffffffffffac;
  Regexp *in_stack_ffffffffffffffb0;
  RegexpOp in_stack_ffffffffffffffcc;
  ParseState *this_01;
  
  this_01 = in_RDI;
  PVar2 = operator&(in_RDI->flags_,DotNL);
  if ((PVar2 != NoParseFlags) && (PVar2 = operator&(in_RDI->flags_,NeverNL), PVar2 == NoParseFlags))
  {
    bVar1 = PushSimpleOp(in_RDI,in_stack_ffffffffffffffcc);
    return bVar1;
  }
  re_00 = (Regexp *)operator_new(0x28);
  PVar2 = in_RDI->flags_;
  b = operator~(FoldCase);
  operator&(PVar2,b);
  Regexp(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  this_00 = (CharClassBuilder *)operator_new(0x40);
  CharClassBuilder::CharClassBuilder(this_00);
  (re_00->field_7).field_3.ccb_ = this_00;
  CharClassBuilder::AddRange(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0);
  CharClassBuilder::AddRange(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0);
  bVar1 = PushRegexp(this_01,re_00);
  return bVar1;
}

Assistant:

bool Regexp::ParseState::PushDot() {
  if ((flags_ & DotNL) && !(flags_ & NeverNL))
    return PushSimpleOp(kRegexpAnyChar);
  // Rewrite . into [^\n]
  Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
  re->ccb_ = new CharClassBuilder;
  re->ccb_->AddRange(0, '\n' - 1);
  re->ccb_->AddRange('\n' + 1, rune_max_);
  return PushRegexp(re);
}